

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O1

void __thiscall
wasm::ParallelFuncCastEmulation::visitCallIndirect
          (ParallelFuncCastEmulation *this,CallIndirect *curr)

{
  ulong uVar1;
  Expression **ppEVar2;
  Type type;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Expression *pEVar3;
  ulong uVar4;
  undefined1 local_1c8 [392];
  size_t local_40;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_38;
  
  uVar1 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  if (this->numParams < uVar1) {
    Fatal::Fatal((Fatal *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8 + 0x10),"max-func-params needs to be at least ",0x25);
    local_40 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    Fatal::operator<<((Fatal *)local_1c8,&local_40);
    Fatal::~Fatal((Fatal *)local_1c8);
  }
  local_38 = &(curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar4) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar2 = ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                &local_38->data)->data;
      pEVar3 = toABI(ppEVar2[uVar4],
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                     ).
                     super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                     .
                     super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                     .currModule);
      ppEVar2[uVar4] = pEVar3;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  this_00 = local_38;
  if ((curr->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements < (ulong)this->numParams) {
    do {
      pEVar3 = LiteralUtils::makeZero
                         ((Type)0x3,
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                          ).
                          super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          .
                          super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          .currModule);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (this_00,pEVar3);
    } while ((curr->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
             < (ulong)this->numParams);
  }
  (curr->heapType).id = (this->ABIType).id;
  type.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id;
  (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 3;
  CallIndirect::finalize(curr);
  pEVar3 = fromABI((Expression *)curr,type,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                   ).
                   super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   .
                   super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   .currModule);
  Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>::
  replaceCurrent(&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                  ).
                  super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                  .
                  super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                 ,pEVar3);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->operands.size() > numParams) {
      Fatal() << "max-func-params needs to be at least "
              << curr->operands.size();
    }
    for (Expression*& operand : curr->operands) {
      operand = toABI(operand, getModule());
    }
    // Add extra operands as needed.
    while (curr->operands.size() < numParams) {
      curr->operands.push_back(LiteralUtils::makeZero(Type::i64, *getModule()));
    }
    // Set the new types
    curr->heapType = ABIType;
    auto oldType = curr->type;
    curr->type = Type::i64;
    curr->finalize(); // may be unreachable
    // Fix up return value
    replaceCurrent(fromABI(curr, oldType, getModule()));
  }